

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsq.hpp
# Opt level: O1

void __thiscall tf::TaskQueue<tf::Node_*>::Array::Array(Array *this,int64_t c)

{
  atomic<tf::Node_*> *__s;
  
  this->C = c;
  this->M = c + -1;
  __s = (atomic<tf::Node_*> *)operator_new__(-(ulong)((ulong)c >> 0x3d != 0) | c * 8);
  if (c != 0) {
    memset(__s,0,c * 8);
  }
  this->S = __s;
  return;
}

Assistant:

explicit Array(int64_t c) :
      C {c},
      M {c-1},
      S {new std::atomic<T>[static_cast<size_t>(C)]} {
    }